

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O2

int perm5(int z,int p_high,int p_low)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint auStack_68 [2];
  int p [14];
  uint auStack_28 [2];
  int z_bit [5];
  
  for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
    auStack_68[lVar4] = (uint)(((uint)p_low >> ((uint)lVar4 & 0x1f) & 1) != 0);
  }
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    p[lVar4 + 7] = (uint)(((uint)p_high >> ((uint)lVar4 & 0x1f) & 1) != 0);
  }
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    auStack_28[lVar4] = (uint)(((uint)z >> ((uint)lVar4 & 0x1f) & 1) != 0);
  }
  for (uVar2 = 0xd; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar5 = (ulong)uVar2;
    if (auStack_68[uVar5] != 0) {
      uVar1 = auStack_28[*(int *)(&DAT_0010b8a0 + uVar5 * 4)];
      iVar3 = *(int *)(&DAT_0010b8e0 + uVar5 * 4);
      auStack_28[*(int *)(&DAT_0010b8a0 + uVar5 * 4)] = auStack_28[iVar3];
      auStack_28[iVar3] = uVar1;
    }
  }
  iVar3 = 0;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    iVar3 = iVar3 + (auStack_28[lVar4] << ((byte)lVar4 & 0x1f));
  }
  return iVar3;
}

Assistant:

int perm5(int z, int p_high, int p_low)
{
	int i, tmp, output, z_bit[5], p[14];
	int index1[] = {0, 2, 1, 3, 0, 1, 0, 3, 1, 0, 2, 1, 0, 1};
	int index2[] = {1, 3, 2, 4, 4, 3, 2, 4, 4, 3, 4, 3, 3, 2};

	/* bits of p_low and p_high are control signals */
	for (i = 0; i < 9; i++)
		p[i] = (p_low >> i) & 0x01;
	for (i = 0; i < 5; i++)
		p[i+9] = (p_high >> i) & 0x01;

	/* bit swapping will be easier with an array of bits */
	for (i = 0; i < 5; i++)
		z_bit[i] = (z >> i) & 0x01;

	/* butterfly operations */
	for (i = 13; i >= 0; i--) {
		/* swap bits according to index arrays if control signal tells us to */
		if (p[i]) {
			tmp = z_bit[index1[i]];
			z_bit[index1[i]] = z_bit[index2[i]];
			z_bit[index2[i]] = tmp;
		}
	}

	/* reconstruct output from rearranged bits */
	output = 0;
	for (i = 0; i < 5; i++)
		output += z_bit[i] << i;

	return(output);
}